

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O1

string * __thiscall
Loader::shiftDR(string *__return_storage_ptr__,Loader *this,int bits,string *write)

{
  Jtag *this_00;
  pointer pcVar1;
  bool bVar2;
  undefined8 uVar3;
  string data;
  string local_70;
  string local_50;
  
  bVar2 = Jtag::navigateToState(this->device,this->currentState,SHIFT_DR);
  if (bVar2) {
    this_00 = this->device;
    pcVar1 = (write->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + write->_M_string_length);
    Jtag::shiftData(&local_70,this_00,bits,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_string_length != 0) {
      bVar2 = Jtag::navigateToState(this->device,EXIT1_DR,RUN_TEST_IDLE);
      if (bVar2) {
        this->currentState = RUN_TEST_IDLE;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_70.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_70.field_2._M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = local_70._M_string_length;
        return __return_storage_ptr__;
      }
      goto LAB_0011289f;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to change to SHIFT_DR state!",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__throw_logic_error(anon_var_dwarf_2567);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to shift data!",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__throw_logic_error(anon_var_dwarf_2567);
LAB_0011289f:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to change to RUN_TEST_IDLE state!",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uVar3 = std::__throw_logic_error(anon_var_dwarf_2567);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

string Loader::shiftDR(int bits, string write) {
	if (!device->navigateToState(currentState, Jtag_fsm::SHIFT_DR)) {
		cerr << "Failed to change to SHIFT_DR state!" << endl;
		return NULL;
	}

	string data = device->shiftData(bits, write);
	if (data.empty()) {
		cerr << "Failed to shift data!" << endl;
		return NULL;
	}
	if (!device->navigateToState(Jtag_fsm::EXIT1_DR, Jtag_fsm::RUN_TEST_IDLE)) {
		cerr << "Failed to change to RUN_TEST_IDLE state!" << endl;
		return NULL;
	}
	currentState = Jtag_fsm::RUN_TEST_IDLE;
	return data;
}